

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_zip_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t n_00;
  uint32_t uVar4;
  int length;
  ulong __n;
  uint64_t uVar5;
  uint64_t uVar6;
  byte bVar7;
  uint16_t mm_2;
  uint16_t nn_2;
  uint16_t *d16;
  uint8_t *m_1;
  uint8_t *n_1;
  uint64_t mm_1;
  uint64_t nn_1;
  uint32_t *m;
  uint32_t *n;
  ARMPredicateReg tmp_m;
  ARMPredicateReg tmp_n;
  int half;
  uint64_t mm;
  uint64_t nn;
  intptr_t i;
  uint64_t *d;
  intptr_t high;
  int esz;
  intptr_t oprsz;
  uint32_t **ppuStack_20;
  uint32_t pred_desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  uVar3 = extract32(pred_desc,0,5);
  __n = (ulong)(uVar3 + 2);
  n_00 = extract32(pred_desc,10,2);
  uVar4 = extract32(pred_desc,0xc,1);
  d = (uint64_t *)(ulong)uVar4;
  bVar7 = (byte)n_00;
  if (__n < 9) {
    uVar6 = *vm;
    length = (uVar3 + 2) * 4;
    uVar5 = extract64(*vn,uVar4 * length,length);
    uVar6 = extract64(uVar6,uVar4 * length,length);
    uVar5 = expand_bits(uVar5,n_00);
    uVar6 = expand_bits(uVar6,n_00);
    *(uint64_t *)vd = uVar5 + (uVar6 << ((byte)(1 << (bVar7 & 0x1f)) & 0x3f));
  }
  else {
    vm_local = vn;
    if ((ulong)((long)vn - (long)vd) < __n) {
      memcpy(tmp_m.p + 3,vn,__n);
      vm_local = tmp_m.p + 3;
    }
    ppuStack_20 = (uint32_t **)vm;
    if ((ulong)((long)vm - (long)vd) < __n) {
      memcpy(&n,vm,__n);
      ppuStack_20 = &n;
    }
    if (d != (uint64_t *)0x0) {
      d = (uint64_t *)((long)__n >> 1);
    }
    if (((ulong)d & 3) == 0) {
      for (nn = 0; (long)nn < (long)((__n + 7) / 8); nn = nn + 1) {
        uVar2 = *(uint *)((long)ppuStack_20 + (((long)d >> 2) + nn) * 4);
        uVar6 = expand_bits((ulong)*(uint *)((long)vm_local + (((long)d >> 2) + nn) * 4),n_00);
        uVar5 = expand_bits((ulong)uVar2,n_00);
        *(uint64_t *)((long)vd + nn * 8) = uVar6 + (uVar5 << ((byte)(1 << (bVar7 & 0x1f)) & 0x3f));
      }
    }
    else {
      for (nn = 0; (long)nn < (long)(__n / 2); nn = nn + 1) {
        bVar1 = *(byte *)((long)ppuStack_20 + (long)d + nn);
        uVar6 = expand_bits((ulong)*(byte *)((long)vm_local + (long)d + nn),n_00);
        uVar5 = expand_bits((ulong)bVar1,n_00);
        *(short *)((long)vd + nn * 2) =
             (short)uVar6 + ((short)uVar5 << ((byte)(1 << (bVar7 & 0x1f)) & 0x1f));
      }
    }
  }
  return;
}

Assistant:

void HELPER(sve_zip_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    int esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    intptr_t high = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd;
    intptr_t i;

    if (oprsz <= 8) {
        uint64_t nn = *(uint64_t *)vn;
        uint64_t mm = *(uint64_t *)vm;
        int half = 4 * oprsz;

        nn = extract64(nn, high * half, half);
        mm = extract64(mm, high * half, half);
        nn = expand_bits(nn, esz);
        mm = expand_bits(mm, esz);
        d[0] = nn + (mm << (1 << esz));
    } else {
        ARMPredicateReg tmp_n, tmp_m;

        /* We produce output faster than we consume input.
           Therefore we must be mindful of possible overlap.  */
        if (((char *)vn - (char *)vd) < (uintptr_t)oprsz) {
            vn = memcpy(&tmp_n, vn, oprsz);
        }
        if (((char *)vm - (char *)vd) < (uintptr_t)oprsz) {
            vm = memcpy(&tmp_m, vm, oprsz);
        }
        if (high) {
            high = oprsz >> 1;
        }

        if ((high & 3) == 0) {
            uint32_t *n = vn, *m = vm;
            high >>= 2;

            for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
                uint64_t nn = n[H4(high + i)];
                uint64_t mm = m[H4(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d[i] = nn + (mm << (1 << esz));
            }
        } else {
            uint8_t *n = vn, *m = vm;
            uint16_t *d16 = vd;

            for (i = 0; i < oprsz / 2; i++) {
                uint16_t nn = n[H1(high + i)];
                uint16_t mm = m[H1(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d16[H2(i)] = nn + (mm << (1 << esz));
            }
        }
    }
}